

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O1

bool __thiscall
gguf_reader::read<long>(gguf_reader *this,vector<long,_std::allocator<long>_> *dst,size_t n)

{
  pointer plVar1;
  size_t sVar2;
  void *__ptr;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  std::vector<long,_std::allocator<long>_>::resize(dst,n);
  plVar1 = (dst->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  bVar5 = (dst->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
          _M_finish == plVar1;
  if (!bVar5) {
    lVar4 = 8;
    sVar2 = fread(plVar1,1,8,(FILE *)this->file);
    if (sVar2 == 8) {
      uVar3 = 0;
      do {
        uVar3 = uVar3 + 1;
        plVar1 = (dst->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        bVar5 = (ulong)((long)(dst->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)plVar1 >> 3) <= uVar3;
        if (bVar5) {
          return bVar5;
        }
        __ptr = (void *)((long)plVar1 + lVar4);
        lVar4 = lVar4 + 8;
        sVar2 = fread(__ptr,1,8,(FILE *)this->file);
      } while (sVar2 == 8);
    }
  }
  return bVar5;
}

Assistant:

bool read(std::vector<T> & dst, const size_t n) const {
        dst.resize(n);
        for (size_t i = 0; i < dst.size(); ++i) {
            if constexpr (std::is_same<T, bool>::value) {
                bool tmp;
                if (!read(tmp)) {
                    return false;
                }
                dst[i] = tmp;
            } else {
                if (!read(dst[i])) {
                    return false;
                }
            }
        }
        return true;
    }